

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void tcu::opt::registerOptions(Parser *parser)

{
  Option<tcu::opt::Validation> local_768;
  Option<tcu::opt::LogFlush> local_730;
  Option<tcu::opt::TestOOM> local_6f8;
  Option<tcu::opt::LogShaderSources> local_6c0;
  Option<tcu::opt::LogImages> local_688;
  Option<tcu::opt::VKDeviceID> local_650;
  Option<tcu::opt::EGLPixmapType> local_618;
  Option<tcu::opt::EGLWindowType> local_5e0;
  Option<tcu::opt::EGLDisplayType> local_5a8;
  Option<tcu::opt::CLBuildOptions> local_570;
  Option<tcu::opt::CLDeviceIDs> local_538;
  Option<tcu::opt::CLPlatformID> local_500;
  Option<tcu::opt::GLContextFlags> local_4c8;
  Option<tcu::opt::GLConfigName> local_490;
  Option<tcu::opt::GLConfigID> local_458;
  Option<tcu::opt::GLContextType> local_420;
  Option<tcu::opt::ScreenRotation> local_3e8;
  Option<tcu::opt::SurfaceType> local_3b0;
  Option<tcu::opt::SurfaceHeight> local_378;
  Option<tcu::opt::SurfaceWidth> local_340;
  Option<tcu::opt::Visibility> local_308;
  Option<tcu::opt::TestIterationCount> local_2d0;
  Option<tcu::opt::BaseSeed> local_298;
  Option<tcu::opt::CrashHandler> local_260;
  Option<tcu::opt::WatchDog> local_228;
  Option<tcu::opt::ExportFilenamePattern> local_1f0;
  Option<tcu::opt::RunMode> local_1b8;
  Option<tcu::opt::LogFilename> local_180;
  Option<tcu::opt::StdinCaseList> local_148;
  Option<tcu::opt::CaseListResource> local_110;
  Option<tcu::opt::CaseListFile> local_d8;
  Option<tcu::opt::CaseList> local_a0;
  Option<tcu::opt::CasePath> local_68;
  
  local_68.shortName = "n";
  local_68.longName = "deqp-case";
  local_68.description = "Test case(s) to run, supports wildcards (e.g. dEQP-GLES2.info.*)";
  local_68.defaultValue = (char *)0x0;
  local_68.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_68.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_68.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::CasePath>(parser,&local_68);
  local_a0.shortName = (char *)0x0;
  local_a0.longName = "deqp-caselist";
  local_a0.description =
       "Case list to run in trie format (e.g. {dEQP-GLES2{info{version,renderer}}})";
  local_a0.defaultValue = (char *)0x0;
  local_a0.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_a0.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_a0.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::CaseList>(parser,&local_a0);
  local_d8.shortName = (char *)0x0;
  local_d8.longName = "deqp-caselist-file";
  local_d8.description = "Read case list (in trie format) from given file";
  local_d8.defaultValue = (char *)0x0;
  local_d8.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_d8.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_d8.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::CaseListFile>(parser,&local_d8);
  local_110.shortName = (char *)0x0;
  local_110.longName = "deqp-caselist-resource";
  local_110.description =
       "Read case list (in trie format) from given file located application\'s assets";
  local_110.defaultValue = (char *)0x0;
  local_110.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_110.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_110.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::CaseListResource>(parser,&local_110);
  local_148.shortName = (char *)0x0;
  local_148.longName = "deqp-stdin-caselist";
  local_148.description = "Read case list (in trie format) from stdin";
  local_148.defaultValue = (char *)0x0;
  local_148.parse = de::cmdline::parseType<bool>;
  local_148.namedValues = (NamedValue<bool> *)0x0;
  local_148.namedValuesEnd = (NamedValue<bool> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::StdinCaseList>(parser,&local_148);
  local_180.shortName = (char *)0x0;
  local_180.longName = "deqp-log-filename";
  local_180.description = "Write test results to given file";
  local_180.defaultValue = "TestResults.qpa";
  local_180.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_180.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_180.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::LogFilename>(parser,&local_180);
  local_1b8.shortName = (char *)0x0;
  local_1b8.longName = "deqp-runmode";
  local_1b8.description = "Execute tests, or write list of test cases into a file";
  local_1b8.defaultValue = "execute";
  local_1b8.parse = (ParseFunc)0x0;
  local_1b8.namedValues = registerOptions::s_runModes;
  local_1b8.namedValuesEnd = (NamedValue<tcu::RunMode> *)registerOptions::s_visibilites;
  de::cmdline::detail::Parser::addOption<tcu::opt::RunMode>(parser,&local_1b8);
  local_1f0.shortName = (char *)0x0;
  local_1f0.longName = "deqp-caselist-export-file";
  local_1f0.description = "Set the target file name pattern for caselist export";
  local_1f0.defaultValue = "${packageName}-cases.${typeExtension}";
  local_1f0.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_1f0.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_1f0.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::ExportFilenamePattern>(parser,&local_1f0);
  local_228.shortName = (char *)0x0;
  local_228.longName = "deqp-watchdog";
  local_228.description = "Enable test watchdog";
  local_228.defaultValue = "disable";
  local_228.parse = (ParseFunc)0x0;
  local_228.namedValues = registerOptions::s_enableNames;
  local_228.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::WatchDog>(parser,&local_228);
  local_260.shortName = (char *)0x0;
  local_260.longName = "deqp-crashhandler";
  local_260.description = "Enable crash handling";
  local_260.defaultValue = "disable";
  local_260.parse = (ParseFunc)0x0;
  local_260.namedValues = registerOptions::s_enableNames;
  local_260.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::CrashHandler>(parser,&local_260);
  local_298.shortName = (char *)0x0;
  local_298.longName = "deqp-base-seed";
  local_298.description = "Base seed for test cases that use randomization";
  local_298.defaultValue = "0";
  local_298.parse = de::cmdline::parseType<int>;
  local_298.namedValues = (NamedValue<int> *)0x0;
  local_298.namedValuesEnd = (NamedValue<int> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::BaseSeed>(parser,&local_298);
  local_2d0.shortName = (char *)0x0;
  local_2d0.longName = "deqp-test-iteration-count";
  local_2d0.description = "Iteration count for cases that support variable number of iterations";
  local_2d0.defaultValue = "0";
  local_2d0.parse = de::cmdline::parseType<int>;
  local_2d0.namedValues = (NamedValue<int> *)0x0;
  local_2d0.namedValuesEnd = (NamedValue<int> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::TestIterationCount>(parser,&local_2d0);
  local_308.shortName = (char *)0x0;
  local_308.longName = "deqp-visibility";
  local_308.description = "Default test window visibility";
  local_308.defaultValue = "windowed";
  local_308.parse = (ParseFunc)0x0;
  local_308.namedValues = registerOptions::s_visibilites;
  local_308.namedValuesEnd = (NamedValue<tcu::WindowVisibility> *)registerOptions::s_surfaceTypes;
  de::cmdline::detail::Parser::addOption<tcu::opt::Visibility>(parser,&local_308);
  local_340.shortName = (char *)0x0;
  local_340.longName = "deqp-surface-width";
  local_340.description = "Use given surface width if possible";
  local_340.defaultValue = "-1";
  local_340.parse = de::cmdline::parseType<int>;
  local_340.namedValues = (NamedValue<int> *)0x0;
  local_340.namedValuesEnd = (NamedValue<int> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::SurfaceWidth>(parser,&local_340);
  local_378.shortName = (char *)0x0;
  local_378.longName = "deqp-surface-height";
  local_378.description = "Use given surface height if possible";
  local_378.defaultValue = "-1";
  local_378.parse = de::cmdline::parseType<int>;
  local_378.namedValues = (NamedValue<int> *)0x0;
  local_378.namedValuesEnd = (NamedValue<int> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::SurfaceHeight>(parser,&local_378);
  local_3b0.shortName = (char *)0x0;
  local_3b0.longName = "deqp-surface-type";
  local_3b0.description = "Use given surface type";
  local_3b0.defaultValue = "window";
  local_3b0.parse = (ParseFunc)0x0;
  local_3b0.namedValues = registerOptions::s_surfaceTypes;
  local_3b0.namedValuesEnd = (NamedValue<tcu::SurfaceType> *)registerOptions::s_screenRotations;
  de::cmdline::detail::Parser::addOption<tcu::opt::SurfaceType>(parser,&local_3b0);
  local_3e8.shortName = (char *)0x0;
  local_3e8.longName = "deqp-screen-rotation";
  local_3e8.description = "Screen rotation for platforms that support it";
  local_3e8.defaultValue = "0";
  local_3e8.parse = (ParseFunc)0x0;
  local_3e8.namedValues = registerOptions::s_screenRotations;
  local_3e8.namedValuesEnd = (NamedValue<tcu::ScreenRotation> *)&DebugOutStreambuf::vtable;
  de::cmdline::detail::Parser::addOption<tcu::opt::ScreenRotation>(parser,&local_3e8);
  local_420.shortName = (char *)0x0;
  local_420.longName = "deqp-gl-context-type";
  local_420.description = "OpenGL context type for platforms that support multiple";
  local_420.defaultValue = (char *)0x0;
  local_420.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_420.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_420.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::GLContextType>(parser,&local_420);
  local_458.shortName = (char *)0x0;
  local_458.longName = "deqp-gl-config-id";
  local_458.description = "OpenGL (ES) render config ID (EGL config id on EGL platforms)";
  local_458.defaultValue = "-1";
  local_458.parse = de::cmdline::parseType<int>;
  local_458.namedValues = (NamedValue<int> *)0x0;
  local_458.namedValuesEnd = (NamedValue<int> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::GLConfigID>(parser,&local_458);
  local_490.shortName = (char *)0x0;
  local_490.longName = "deqp-gl-config-name";
  local_490.description = "Symbolic OpenGL (ES) render config name";
  local_490.defaultValue = (char *)0x0;
  local_490.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_490.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_490.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::GLConfigName>(parser,&local_490);
  local_4c8.shortName = (char *)0x0;
  local_4c8.longName = "deqp-gl-context-flags";
  local_4c8.description = "OpenGL context flags (comma-separated, supports debug and robust)";
  local_4c8.defaultValue = (char *)0x0;
  local_4c8.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_4c8.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_4c8.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::GLContextFlags>(parser,&local_4c8);
  local_500.shortName = (char *)0x0;
  local_500.longName = "deqp-cl-platform-id";
  local_500.description = "Execute tests on given OpenCL platform (IDs start from 1)";
  local_500.defaultValue = "1";
  local_500.parse = de::cmdline::parseType<int>;
  local_500.namedValues = (NamedValue<int> *)0x0;
  local_500.namedValuesEnd = (NamedValue<int> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::CLPlatformID>(parser,&local_500);
  local_538.shortName = (char *)0x0;
  local_538.longName = "deqp-cl-device-ids";
  local_538.description = "Execute tests on given CL devices (comma-separated, IDs start from 1)";
  local_538.defaultValue = glcts::fixed_sample_locations_values + 1;
  local_538.parse = parseIntList;
  local_538.namedValues = (NamedValue<std::vector<int,_std::allocator<int>_>_> *)0x0;
  local_538.namedValuesEnd = (NamedValue<std::vector<int,_std::allocator<int>_>_> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::CLDeviceIDs>(parser,&local_538);
  local_570.shortName = (char *)0x0;
  local_570.longName = "deqp-cl-build-options";
  local_570.description = "Extra build options for OpenCL compiler";
  local_570.defaultValue = (char *)0x0;
  local_570.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_570.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_570.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::CLBuildOptions>(parser,&local_570);
  local_5a8.shortName = (char *)0x0;
  local_5a8.longName = "deqp-egl-display-type";
  local_5a8.description = "EGL native display type";
  local_5a8.defaultValue = (char *)0x0;
  local_5a8.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_5a8.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_5a8.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::EGLDisplayType>(parser,&local_5a8);
  local_5e0.shortName = (char *)0x0;
  local_5e0.longName = "deqp-egl-window-type";
  local_5e0.description = "EGL native window type";
  local_5e0.defaultValue = (char *)0x0;
  local_5e0.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_5e0.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_5e0.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::EGLWindowType>(parser,&local_5e0);
  local_618.shortName = (char *)0x0;
  local_618.longName = "deqp-egl-pixmap-type";
  local_618.description = "EGL native pixmap type";
  local_618.defaultValue = (char *)0x0;
  local_618.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_618.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_618.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::EGLPixmapType>(parser,&local_618);
  local_650.shortName = (char *)0x0;
  local_650.longName = "deqp-vk-device-id";
  local_650.description = "Vulkan device ID (IDs start from 1)";
  local_650.defaultValue = "1";
  local_650.parse = de::cmdline::parseType<int>;
  local_650.namedValues = (NamedValue<int> *)0x0;
  local_650.namedValuesEnd = (NamedValue<int> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::VKDeviceID>(parser,&local_650);
  local_688.shortName = (char *)0x0;
  local_688.longName = "deqp-log-images";
  local_688.description = "Enable or disable logging of result images";
  local_688.defaultValue = "enable";
  local_688.parse = (ParseFunc)0x0;
  local_688.namedValues = registerOptions::s_enableNames;
  local_688.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::LogImages>(parser,&local_688);
  local_6c0.shortName = (char *)0x0;
  local_6c0.longName = "deqp-log-shader-sources";
  local_6c0.description = "Enable or disable logging of shader sources";
  local_6c0.defaultValue = "enable";
  local_6c0.parse = (ParseFunc)0x0;
  local_6c0.namedValues = registerOptions::s_enableNames;
  local_6c0.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::LogShaderSources>(parser,&local_6c0);
  local_6f8.shortName = (char *)0x0;
  local_6f8.longName = "deqp-test-oom";
  local_6f8.description = "Run tests that exhaust memory on purpose";
  local_6f8.defaultValue = "disable";
  local_6f8.parse = (ParseFunc)0x0;
  local_6f8.namedValues = registerOptions::s_enableNames;
  local_6f8.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::TestOOM>(parser,&local_6f8);
  local_730.shortName = (char *)0x0;
  local_730.longName = "deqp-log-flush";
  local_730.description = "Enable or disable log file fflush";
  local_730.defaultValue = "enable";
  local_730.parse = (ParseFunc)0x0;
  local_730.namedValues = registerOptions::s_enableNames;
  local_730.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::LogFlush>(parser,&local_730);
  local_768.shortName = (char *)0x0;
  local_768.longName = "deqp-validation";
  local_768.description = "Enable or disable test case validation";
  local_768.defaultValue = "disable";
  local_768.parse = (ParseFunc)0x0;
  local_768.namedValues = registerOptions::s_enableNames;
  local_768.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::Validation>(parser,&local_768);
  return;
}

Assistant:

void registerOptions (de::cmdline::Parser& parser)
{
	using de::cmdline::Option;
	using de::cmdline::NamedValue;

	static const NamedValue<bool> s_enableNames[] =
	{
		{ "enable",		true	},
		{ "disable",	false	}
	};
	static const NamedValue<tcu::RunMode> s_runModes[] =
	{
		{ "execute",		RUNMODE_EXECUTE				},
		{ "xml-caselist",	RUNMODE_DUMP_XML_CASELIST	},
		{ "txt-caselist",	RUNMODE_DUMP_TEXT_CASELIST	},
		{ "stdout-caselist",RUNMODE_DUMP_STDOUT_CASELIST}
	};
	static const NamedValue<WindowVisibility> s_visibilites[] =
	{
		{ "windowed",		WINDOWVISIBILITY_WINDOWED	},
		{ "fullscreen",		WINDOWVISIBILITY_FULLSCREEN	},
		{ "hidden",			WINDOWVISIBILITY_HIDDEN		}
	};
	static const NamedValue<tcu::SurfaceType> s_surfaceTypes[] =
	{
		{ "window",			SURFACETYPE_WINDOW				},
		{ "pixmap",			SURFACETYPE_OFFSCREEN_NATIVE	},
		{ "pbuffer",		SURFACETYPE_OFFSCREEN_GENERIC	},
		{ "fbo",			SURFACETYPE_FBO					}
	};
	static const NamedValue<tcu::ScreenRotation> s_screenRotations[] =
	{
		{ "unspecified",	SCREENROTATION_UNSPECIFIED	},
		{ "0",				SCREENROTATION_0			},
		{ "90",				SCREENROTATION_90			},
		{ "180",			SCREENROTATION_180			},
		{ "270",			SCREENROTATION_270			}
	};

	parser
		<< Option<CasePath>				("n",		"deqp-case",					"Test case(s) to run, supports wildcards (e.g. dEQP-GLES2.info.*)")
		<< Option<CaseList>				(DE_NULL,	"deqp-caselist",				"Case list to run in trie format (e.g. {dEQP-GLES2{info{version,renderer}}})")
		<< Option<CaseListFile>			(DE_NULL,	"deqp-caselist-file",			"Read case list (in trie format) from given file")
		<< Option<CaseListResource>		(DE_NULL,	"deqp-caselist-resource",		"Read case list (in trie format) from given file located application's assets")
		<< Option<StdinCaseList>		(DE_NULL,	"deqp-stdin-caselist",			"Read case list (in trie format) from stdin")
		<< Option<LogFilename>			(DE_NULL,	"deqp-log-filename",			"Write test results to given file",					"TestResults.qpa")
		<< Option<RunMode>				(DE_NULL,	"deqp-runmode",					"Execute tests, or write list of test cases into a file",
																																		s_runModes,			"execute")
		<< Option<ExportFilenamePattern>(DE_NULL,	"deqp-caselist-export-file",	"Set the target file name pattern for caselist export",					"${packageName}-cases.${typeExtension}")
		<< Option<WatchDog>				(DE_NULL,	"deqp-watchdog",				"Enable test watchdog",								s_enableNames,		"disable")
		<< Option<CrashHandler>			(DE_NULL,	"deqp-crashhandler",			"Enable crash handling",							s_enableNames,		"disable")
		<< Option<BaseSeed>				(DE_NULL,	"deqp-base-seed",				"Base seed for test cases that use randomization",						"0")
		<< Option<TestIterationCount>	(DE_NULL,	"deqp-test-iteration-count",	"Iteration count for cases that support variable number of iterations",	"0")
		<< Option<Visibility>			(DE_NULL,	"deqp-visibility",				"Default test window visibility",					s_visibilites,		"windowed")
		<< Option<SurfaceWidth>			(DE_NULL,	"deqp-surface-width",			"Use given surface width if possible",									"-1")
		<< Option<SurfaceHeight>		(DE_NULL,	"deqp-surface-height",			"Use given surface height if possible",									"-1")
		<< Option<SurfaceType>			(DE_NULL,	"deqp-surface-type",			"Use given surface type",							s_surfaceTypes,		"window")
		<< Option<ScreenRotation>		(DE_NULL,	"deqp-screen-rotation",			"Screen rotation for platforms that support it",	s_screenRotations,	"0")
		<< Option<GLContextType>		(DE_NULL,	"deqp-gl-context-type",			"OpenGL context type for platforms that support multiple")
		<< Option<GLConfigID>			(DE_NULL,	"deqp-gl-config-id",			"OpenGL (ES) render config ID (EGL config id on EGL platforms)",		"-1")
		<< Option<GLConfigName>			(DE_NULL,	"deqp-gl-config-name",			"Symbolic OpenGL (ES) render config name")
		<< Option<GLContextFlags>		(DE_NULL,	"deqp-gl-context-flags",		"OpenGL context flags (comma-separated, supports debug and robust)")
		<< Option<CLPlatformID>			(DE_NULL,	"deqp-cl-platform-id",			"Execute tests on given OpenCL platform (IDs start from 1)",			"1")
		<< Option<CLDeviceIDs>			(DE_NULL,	"deqp-cl-device-ids",			"Execute tests on given CL devices (comma-separated, IDs start from 1)",	parseIntList,	"")
		<< Option<CLBuildOptions>		(DE_NULL,	"deqp-cl-build-options",		"Extra build options for OpenCL compiler")
		<< Option<EGLDisplayType>		(DE_NULL,	"deqp-egl-display-type",		"EGL native display type")
		<< Option<EGLWindowType>		(DE_NULL,	"deqp-egl-window-type",			"EGL native window type")
		<< Option<EGLPixmapType>		(DE_NULL,	"deqp-egl-pixmap-type",			"EGL native pixmap type")
		<< Option<VKDeviceID>			(DE_NULL,	"deqp-vk-device-id",			"Vulkan device ID (IDs start from 1)",									"1")
		<< Option<LogImages>			(DE_NULL,	"deqp-log-images",				"Enable or disable logging of result images",		s_enableNames,		"enable")
		<< Option<LogShaderSources>		(DE_NULL,	"deqp-log-shader-sources",		"Enable or disable logging of shader sources",		s_enableNames,		"enable")
		<< Option<TestOOM>				(DE_NULL,	"deqp-test-oom",				"Run tests that exhaust memory on purpose",			s_enableNames,		TEST_OOM_DEFAULT)
		<< Option<LogFlush>				(DE_NULL,	"deqp-log-flush",				"Enable or disable log file fflush",				s_enableNames,		"enable")
		<< Option<Validation>			(DE_NULL,	"deqp-validation",				"Enable or disable test case validation",			s_enableNames,		"disable");
}